

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

double __thiscall gmath::PinholeCamera::projectPoint(PinholeCamera *this,Vector2d *p,Vector3d *Pw)

{
  Distortion *pDVar1;
  int i_1;
  Matrix33d *pMVar2;
  undefined8 *puVar3;
  int k_1;
  long lVar4;
  Matrix33d *pMVar5;
  int i;
  long lVar6;
  double dVar7;
  Vector3d Pc;
  SVector<double,_3> ret_1;
  SMatrix<double,_3,_3> ret;
  double local_b8 [4];
  double local_98 [4];
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 local_18;
  
  pMVar2 = &(this->super_Camera).R;
  puVar3 = &local_58;
  local_40 = 0;
  local_30 = 0;
  uStack_28 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_20 = 0;
  local_58 = 0x3ff0000000000000;
  uStack_38 = 0x3ff0000000000000;
  local_18 = 0x3ff0000000000000;
  lVar4 = 0;
  do {
    lVar6 = 0;
    pMVar5 = pMVar2;
    do {
      puVar3[lVar6] = pMVar5->v[0][0];
      lVar6 = lVar6 + 1;
      pMVar5 = (Matrix33d *)(pMVar5->v + 1);
    } while (lVar6 != 3);
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 3;
    pMVar2 = (Matrix33d *)(pMVar2->v[0] + 1);
  } while (lVar4 != 3);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  lVar4 = 0;
  do {
    local_98[lVar4] = Pw->v[lVar4] - (this->super_Camera).T.v[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b8[0] = 0.0;
  local_b8[1] = 0.0;
  local_b8[2] = 0.0;
  puVar3 = &local_58;
  lVar4 = 0;
  do {
    dVar7 = local_b8[lVar4];
    lVar6 = 0;
    do {
      dVar7 = dVar7 + (double)puVar3[lVar6] * local_98[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    local_b8[lVar4] = dVar7;
    local_68 = local_b8[2];
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + 3;
  } while (lVar4 != 3);
  local_78 = this->rho;
  lVar4 = 0;
  do {
    local_b8[lVar4] = local_b8[lVar4] / local_68;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  pDVar1 = this->dist;
  if (pDVar1 != (Distortion *)0x0) {
    uStack_60 = 0;
    uStack_70 = 0;
    (*pDVar1->_vptr_Distortion[6])(local_b8[0],pDVar1,local_b8);
  }
  *(double *)p = (this->A).v[0][0] * local_b8[0] + (this->A).v[0][1] * local_b8[1] +
                 (this->A).v[0][2];
  *(double *)(p + 8) = local_b8[1] * (this->A).v[1][1] + (this->A).v[1][2];
  return (double)(~-(ulong)(0.0 < local_68) & 0xbff0000000000000 |
                 (~-(ulong)(local_78 != 0.0) & 0x7ff0000000000000 |
                 (ulong)(local_78 / local_68) & -(ulong)(local_78 != 0.0)) &
                 -(ulong)(0.0 < local_68));
}

Assistant:

double PinholeCamera::projectPoint(Vector2d &p, const Vector3d &Pw) const
{
  // transform into camera coordiante system

  Vector3d Pc=transpose(getR())*(Pw-getT());

  // if rho is given, then compute disparity and determine if the point
  // is behind the camera

  double d=std::numeric_limits<double>::infinity();

  if (rho != 0)
  {
    d=rho/Pc[2];
  }

  if (Pc[2] <= 0)
  {
    d=-1;
  }

  // apply lens distortion

  Pc/=Pc[2];

  if (dist != 0)
  {
    const double x=Pc[0];
    const double y=Pc[1];
    dist->transform(Pc[0], Pc[1], x, y);
  }

  // apply camera matrix

  p[0]=A(0, 0)*Pc[0]+A(0, 1)*Pc[1]+A(0, 2);
  p[1]=A(1, 1)*Pc[1]+A(1, 2);

  return d;
}